

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v11::detail::bigint::remove_leading_zeros(bigint *this)

{
  int iVar1;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar2;
  
  uVar3 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar4 = 1;
  if ((int)uVar3 < 1) {
    uVar4 = uVar3 & 0xffffffff;
  }
  puVar5 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar3 & 0xffffffff);
  do {
    uVar2 = uVar3;
    puVar5 = puVar5 + -1;
    iVar1 = (int)uVar2;
    if (iVar1 < 2) goto LAB_0022f6d6;
    uVar3 = (ulong)(iVar1 - 1);
  } while (*puVar5 == 0);
  uVar4 = uVar2 & 0xffffffff;
LAB_0022f6d6:
  uVar3 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar3 < uVar4) {
    (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,uVar4);
    uVar3 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  }
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
  return;
}

Assistant:

FMT_CONSTEXPR void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }